

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_match_path.c
# Opt level: O0

void test_exclusion_from_file_mbs(void)

{
  wchar_t wVar1;
  archive *paVar2;
  archive *m;
  
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'²',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    wVar1 = archive_match_exclude_pattern_from_file(paVar2,"exclusion",L'\0');
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                        ,L'µ',0,"0",(long)wVar1,
                        "archive_match_exclude_pattern_from_file(m, \"exclusion\", 0)",paVar2);
    exclusion_from_file(paVar2);
    archive_match_free(paVar2);
    paVar2 = archive_match_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                             ,L'»',(uint)(paVar2 != (archive *)0x0),
                             "(m = archive_match_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_exclude_pattern_from_file(paVar2,"exclusion_null",L'\x01');
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'¿',0,"0",(long)wVar1,
                          "archive_match_exclude_pattern_from_file(m, \"exclusion_null\", 1)",paVar2
                         );
      exclusion_from_file(paVar2);
      archive_match_free(paVar2);
    }
  }
  return;
}

Assistant:

static void
test_exclusion_from_file_mbs(void)
{
	struct archive *m;

	/* Test1: read exclusion patterns from file */
	if (!assert((m = archive_match_new()) != NULL))
		return;
	assertEqualIntA(m, 0,
	    archive_match_exclude_pattern_from_file(m, "exclusion", 0));
	exclusion_from_file(m);
	/* Clean up. */
	archive_match_free(m);

	/* Test2: read exclusion patterns in a null separator from file */
	if (!assert((m = archive_match_new()) != NULL))
		return;
	/* Test for pattern reading from file */
	assertEqualIntA(m, 0,
	    archive_match_exclude_pattern_from_file(m, "exclusion_null", 1));
	exclusion_from_file(m);
	/* Clean up. */
	archive_match_free(m);
}